

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O0

int profitCB(void *mystate,void *ud)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  uint8_t *puVar4;
  prf_node_t **array;
  ushort uVar5;
  int iVar6;
  bool_t bVar7;
  uint uVar8;
  prf_node_t *ppVar9;
  faceset *pfVar10;
  size_t sVar11;
  char *pcVar12;
  prf_model_t *model;
  matrix4x4_f32_t *m;
  int *piVar13;
  prf_state_t *in_RDI;
  int dotex;
  float *mat;
  uint32_t *ptr_1;
  uint32_t *ptr;
  int insub;
  prf_texture_s tex;
  faceset *data_1;
  unsigned_short transparency;
  short material_index;
  short texture_pattern_index;
  int idx;
  unsigned_short lightmode;
  uint packed_color;
  prf_face_data *face;
  int n_2;
  int n_1;
  int i_1;
  prf_node_t *node;
  prf_group_data *data;
  prf_state_t *state;
  prf_vertex_s vertex;
  prf_node_t **children;
  float tmp [3];
  int n;
  int i;
  prf_nodeinfo_t *info;
  prf_node_t *in_stack_fffffffffffffde8;
  float fVar14;
  prf_state_t *in_stack_fffffffffffffdf0;
  prf_texture_t *in_stack_fffffffffffffdf8;
  uint uVar15;
  prf_state_t *in_stack_fffffffffffffe00;
  prf_state_t *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  prf_state_t *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  undefined8 in_stack_fffffffffffffe40;
  prf_model_t *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe58;
  int iVar16;
  uint in_stack_fffffffffffffe5c;
  prf_node_t *in_stack_fffffffffffffe60;
  uint local_b4;
  int local_9c;
  ushort local_66;
  int local_44;
  float local_34;
  float local_30;
  float local_2c;
  int local_28;
  int local_24;
  prf_nodeinfo_t *local_20;
  
  uVar8 = (uint)((ulong)in_stack_fffffffffffffe10 >> 0x20);
  if (in_RDI->node->opcode == 2) {
    if ((*(uint *)(in_RDI->node->data + 0xc) & 0x60000000) != 0) {
      prf_state_push(in_stack_fffffffffffffdf0);
      prf_model_traverse_io_
                (in_stack_fffffffffffffe60,
                 (prf_state_t *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      prf_state_pop(in_stack_fffffffffffffdf0);
      return 2;
    }
  }
  else {
    if (in_RDI->node->opcode == 0x3e) {
      return 2;
    }
    if (in_RDI->node->opcode == 0x3d) {
      ppVar9 = prf_state_get_instance_from_node(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8)
      ;
      if (ppVar9 == (prf_node_t *)0x0) {
        array_count(in_RDI->instances);
      }
      else {
        iVar16 = array_count(ppVar9->children);
        prf_state_push(in_stack_fffffffffffffdf0);
        for (local_9c = 0; local_9c < iVar16; local_9c = local_9c + 1) {
          prf_model_traverse_io_
                    (in_stack_fffffffffffffe60,
                     (prf_state_t *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        }
        prf_state_pop(in_stack_fffffffffffffdf0);
      }
      return 1;
    }
  }
  local_20 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_fffffffffffffde8 >> 0x30));
  if (in_RDI->node->opcode == 5) {
    vertexarray = (float *)_array_set_count(vertexarray,0);
    texcoordarray = (float *)_array_set_count(texcoordarray,0);
    colorarray = (int *)_array_set_count(colorarray,0);
    puVar4 = in_RDI->node->data;
    if ((*(uint *)(puVar4 + 0x28) & 0x4000000) == 0) {
      profitCB::is_in_face = 1;
      profitCB::color_per_vertex = 0;
      if ((puVar4[0x2c] == '\x01') || (puVar4[0x2c] == '\x03')) {
        profitCB::color_per_vertex = 1;
      }
      if ((*(uint *)(puVar4 + 0x28) & 0x50000000) == 0) {
        uVar15 = (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (ofversion < 0x5dc) {
          local_b4 = my_palette_lookup(in_stack_fffffffffffffe00,uVar15);
        }
        else {
          local_b4 = my_palette_lookup(in_stack_fffffffffffffe00,uVar15);
        }
      }
      else {
        local_b4 = *(uint *)(puVar4 + 0x34);
      }
      uVar15 = (uint)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      sVar2 = *(short *)(puVar4 + 0x18);
      sVar3 = *(short *)(puVar4 + 0x1a);
      uVar5 = (ushort)((uint)*(ushort *)(puVar4 + 0x24) * (uint)in_RDI->object_transparency >> 0x10)
      ;
      bVar1 = puVar4[0x2c];
      local_34 = (float)local_b4;
      local_30 = (float)(int)sVar3 * 65536.0 + (float)(int)sVar2;
      local_2c = (float)in_RDI->subface_level * 65536.0 * 256.0 +
                 (float)(ushort)bVar1 * 65536.0 + (float)uVar5;
      profitCB::current_index =
           bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
      iVar16 = profitCB::current_index;
      iVar6 = array_count(facesets);
      if (iVar6 <= iVar16) {
        pfVar10 = faceset_create();
        pfVar10->packed_color = local_b4;
        pfVar10->texture_pattern_index = sVar2;
        pfVar10->texture_pattern_filename = (char *)0x0;
        pfVar10->subface_level = (uint)in_RDI->subface_level;
        if (((-1 < sVar2) &&
            (bVar7 = prf_state_texture_lookup
                               (in_stack_fffffffffffffe08,uVar15,in_stack_fffffffffffffdf8),
            bVar7 != 0)) && (sVar11 = strlen(&stack0xfffffffffffffe5c), sVar11 != 0)) {
          sVar11 = strlen(&stack0xfffffffffffffe5c);
          pcVar12 = (char *)malloc(sVar11 + 1);
          pfVar10->texture_pattern_filename = pcVar12;
          strcpy(pfVar10->texture_pattern_filename,&stack0xfffffffffffffe5c);
        }
        pfVar10->material_index = sVar3;
        pfVar10->transparency = uVar5;
        pfVar10->lightmode = (ushort)bVar1;
        bVar7 = prf_state_material_lookup
                          (in_stack_fffffffffffffe18,uVar8,
                           (prf_material_t *)in_stack_fffffffffffffe08);
        if (bVar7 == 0) {
          set_default_material(&pfVar10->material);
        }
        facesets = _array_append_ptr(&in_stack_fffffffffffffdf0->model,in_stack_fffffffffffffde8);
      }
      array = in_RDI->node->children;
      if (array != (prf_node_t **)0x0) {
        iVar16 = 0;
        local_28 = array_count(array);
        prf_state_push(in_stack_fffffffffffffdf0);
        for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
          if (array[local_24]->opcode == 0x13) {
            iVar16 = 1;
          }
          if (iVar16 == 0) {
            prf_model_traverse_io_
                      (in_stack_fffffffffffffe60,
                       (prf_state_t *)((ulong)in_stack_fffffffffffffe5c << 0x20));
          }
          if (array[local_24]->opcode == 0x14) {
            iVar16 = 0;
          }
        }
        prf_state_pop(in_stack_fffffffffffffdf0);
        prf_state_push(in_stack_fffffffffffffdf0);
        iVar16 = 0;
        for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
          if (array[local_24]->opcode == 0x13) {
            iVar16 = 1;
          }
          if (iVar16 != 0) {
            prf_model_traverse_io_
                      (in_stack_fffffffffffffe60,
                       (prf_state_t *)CONCAT44(in_stack_fffffffffffffe5c,iVar16));
          }
          if (array[local_24]->opcode == 0x14) {
            iVar16 = 0;
          }
        }
        prf_state_pop(in_stack_fffffffffffffdf0);
      }
    }
    return 2;
  }
  if ((profitCB::is_in_face == 0) || (in_RDI->node->opcode != 0x48)) {
    if ((profitCB::is_in_face == 0) || (in_RDI->node->opcode != 0x59)) {
      if (profitCB::is_in_face != 0) {
        bVar7 = prf_vertex_lookup((prf_node_t *)in_stack_fffffffffffffdf8,
                                  (prf_vertex_t *)in_stack_fffffffffffffdf0);
        uVar8 = (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if (bVar7 != 0) {
          vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                            (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
          fVar14 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
          vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          if (profitCB::color_per_vertex == 0) {
            return 1;
          }
          if ((local_66 & 0x2000) != 0) {
            colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,(int)fVar14);
            return 1;
          }
          if ((local_66 & 0x1000) != 0) {
            colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,(int)fVar14);
            return 1;
          }
          my_palette_lookup(in_stack_fffffffffffffe00,uVar8);
          colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,(int)fVar14);
          return 1;
        }
      }
      if ((profitCB::is_in_face != 0) && (in_RDI->node->opcode == 0xb)) {
        profitCB::is_in_face = 0;
        m = prf_state_get_matrix(in_RDI);
        iVar16 = array_count(vertexarray);
        if (iVar16 != 3) {
          iVar16 = array_count(vertexarray);
          if (iVar16 == 6) {
            get_coords_3d(vertexarray,0,&local_34);
            mult_matrix_vec((float *)m,&local_34);
            bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
            piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                        (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            *(int **)((long)facesets[profitCB::current_index] + 0x20) = piVar13;
            get_coords_3d(vertexarray,1,&local_34);
            mult_matrix_vec((float *)m,&local_34);
            bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
            piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                        (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            *(int **)((long)facesets[profitCB::current_index] + 0x20) = piVar13;
            piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                        (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            *(int **)((long)facesets[profitCB::current_index] + 0x20) = piVar13;
            if (profitCB::color_per_vertex != 0) {
              packed_to_vec(*colorarray,&local_34);
              bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
              piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                          (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
              *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
              packed_to_vec(colorarray[1],&local_34);
              bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
              iVar16 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
              piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
              *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
              piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
              *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
            }
          }
          else {
            iVar16 = array_count(vertexarray);
            if (8 < iVar16) {
              uVar8 = (uint)(-1 < *(short *)((long)facesets[profitCB::current_index] + 0x3c));
              local_28 = array_count(vertexarray);
              local_28 = local_28 / 3;
              for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
                get_coords_3d(vertexarray,local_24,&local_34);
                mult_matrix_vec((float *)m,&local_34);
                bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
                piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                            (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
                *(int **)((long)facesets[profitCB::current_index] + 0x18) = piVar13;
                if (uVar8 != 0) {
                  get_coords_2d(texcoordarray,local_24,&local_34);
                  in_stack_fffffffffffffdf0 =
                       *(prf_state_t **)((long)facesets[profitCB::current_index] + 0x28);
                  bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
                  piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                              (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
                  *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar13;
                }
                if (profitCB::color_per_vertex != 0) {
                  packed_to_vec(colorarray[local_24],&local_34);
                  in_stack_fffffffffffffde8 =
                       *(prf_node_t **)((long)facesets[profitCB::current_index] + 0x10);
                  bsp_add_point(in_stack_fffffffffffffdf0,(float *)in_stack_fffffffffffffde8);
                  piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                              (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
                  *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
                }
              }
              piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                          (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
              iVar16 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
              *(int **)((long)facesets[profitCB::current_index] + 0x18) = piVar13;
              if (uVar8 != 0) {
                piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
                *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar13;
              }
              if (profitCB::color_per_vertex != 0) {
                piVar13 = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
                *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar13;
              }
            }
          }
        }
      }
    }
    else {
      local_28 = prf_morph_vertex_list_get_count(in_RDI->node);
      local_28 = local_28 << 1;
      model = (prf_model_t *)prf_morph_vertex_list_get_list_ptr(in_RDI->node);
      for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 2) {
        prf_model_vertex_palette_lookup
                  (model,(uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                   (prf_vertex_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
        vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                          (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                          (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                          (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        fVar14 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
        if (local_44 == 0) {
          texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          texcoordarray =
               _array_append_float((float *)in_stack_fffffffffffffdf0,
                                   (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        }
        else {
          texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
          texcoordarray =
               _array_append_float((float *)in_stack_fffffffffffffdf0,
                                   (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        }
        if (profitCB::color_per_vertex != 0) {
          iVar16 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
          if ((local_66 & 0x2000) == 0) {
            if ((local_66 & 0x1000) == 0) {
              my_palette_lookup(in_stack_fffffffffffffe00,
                                (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
              colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                             (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
            }
            else {
              colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
            }
          }
          else {
            colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
          }
        }
      }
    }
  }
  else {
    local_28 = prf_vertex_list_get_count(in_stack_fffffffffffffde8);
    prf_vertex_list_get_list_ptr(in_stack_fffffffffffffde8);
    for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
      prf_model_vertex_palette_lookup
                (in_stack_fffffffffffffe48,(uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                 (prf_vertex_t *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                        (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                        (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      vertexarray = _array_append_float((float *)in_stack_fffffffffffffdf0,
                                        (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      fVar14 = (float)((ulong)in_stack_fffffffffffffde8 >> 0x20);
      if (local_44 == 0) {
        texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
        texcoordarray =
             _array_append_float((float *)in_stack_fffffffffffffdf0,
                                 (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      }
      else {
        texcoordarray = _array_append_float((float *)in_stack_fffffffffffffdf0,fVar14);
        texcoordarray =
             _array_append_float((float *)in_stack_fffffffffffffdf0,
                                 (float)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      }
      if (profitCB::color_per_vertex != 0) {
        iVar16 = (int)((ulong)in_stack_fffffffffffffde8 >> 0x20);
        if ((local_66 & 0x2000) == 0) {
          if ((local_66 & 0x1000) == 0) {
            my_palette_lookup(in_stack_fffffffffffffe00,
                              (uint)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
            colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,
                                           (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
          }
          else {
            colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
          }
        }
        else {
          colorarray = _array_append_int((int *)in_stack_fffffffffffffdf0,iVar16);
        }
      }
    }
  }
  return 1;
}

Assistant:

static int
profitCB(void *mystate, void *ud)
{
  static int is_in_face = 0;
  static int current_index = -1;
  static int color_per_vertex = 0;
  prf_nodeinfo_t *info;
  int i,n;
  float tmp[3];
  prf_node_t **children;
  struct prf_vertex_s vertex;

  prf_state_t * state = (prf_state_t *)mystate;

  if (state->node->opcode == GROUP_OPCODE) {
    struct prf_group_data *data = (struct prf_group_data*) state->node->data;
    if (data->flags & PRF_GROUP_FLAG_ANIMATION) {
      assert(state->node->children && array_count(state->node->children) > 2);
      prf_state_push(state);
      prf_model_traverse_io_(state->node->children[1], state);
      prf_state_pop(state);
      return PRF_TRAV_SIBLING;
    }
  }
  else if (state->node->opcode == DEF_OPCODE) {
    return PRF_TRAV_SIBLING;
  }
  else if (state->node->opcode == REF_OPCODE) {
    prf_node_t *node = prf_state_get_instance_from_node(state, state->node);
    if (node) {
      int i, n = array_count(node->children);
      prf_state_push(state);
      for (i = 0; i < n; i++) {
	prf_model_traverse_io_(node->children[i], state);
      }
      prf_state_pop(state);
    }
    else {
      int n = array_count(state->instances);
    }
    assert(node);
    return PRF_TRAV_CONTINUE;
  }

  info = prf_nodeinfo_get(state->node->opcode);

  if (state->node->opcode == FACE_OPCODE) {
    struct prf_face_data *face;
    unsigned int packed_color;
    unsigned short lightmode;
    int idx;

    vertexarray=(float *)_array_set_count(vertexarray, 0);
    texcoordarray=(float *)_array_set_count(texcoordarray, 0);
    colorarray=(int *)_array_set_count(colorarray, 0);

    face = (struct prf_face_data*) state->node->data;

    if (!(face->flags & PRF_FACE_FLAGS_HIDDEN)) {
      short texture_pattern_index;
      short material_index;
      unsigned short transparency;
      is_in_face = 1;
      color_per_vertex = 0;
      if (face->light_mode == 1 || face->light_mode == 3) {
        color_per_vertex = 1;
      }

      packed_color = face->color_name_index;

      if (face->flags & 0x50000000) {
        packed_color = face->packed_color_primary;
      }
      else {
        if (ofversion < 1500) {
          packed_color = my_palette_lookup(state, face->color_name_index);
        }
        else {
          packed_color = my_palette_lookup(state, face->primary_color_index);
        }
      }
      texture_pattern_index = face->texture_pattern_index;
      material_index = face->material_index;

      transparency = (unsigned short)
        (((int32_t)(face->transparency) *
          (int32_t)(state->object_transparency)) >> 16);

      lightmode = face->light_mode;

      tmp[0] = (float) packed_color;
      tmp[1] = (float) texture_pattern_index +
        (float) material_index * 65536.0f;
      tmp[2] = (float) transparency +
        (float) lightmode * 65536.0f +
        (float) state->subface_level * 65536.0f * 256.0f;

      idx = bsp_add_point(materialLookup, tmp);
      current_index = idx;

      if (idx >= array_count(facesets)) {
        faceset *data = faceset_create();

        data->packed_color = packed_color;
        data->texture_pattern_index = texture_pattern_index;
        data->texture_pattern_filename = NULL;
        data->subface_level = state->subface_level;

        if (texture_pattern_index >= 0) {
          struct prf_texture_s tex;

          if (prf_state_texture_lookup(state, texture_pattern_index, &tex)) {

            if (strlen(tex.filename)) {
              data->texture_pattern_filename =
                (char *)malloc(strlen(tex.filename)+1);
              strcpy(data->texture_pattern_filename, tex.filename);
            }
          }
        }
         data->material_index = material_index;
         data->transparency = transparency;
         data->lightmode = lightmode;

         if (prf_state_material_lookup(state, material_index,
                                       &data->material)) {
             // FIXME: implement proper action
         }
         else {
           set_default_material(&data->material);
         }

         array_append_ptr(facesets, data);
      }

      children = state->node->children;
      if (children) {
        int insub = 0;
        n = array_count(children);

        prf_state_push(state);
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (!insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);

        prf_state_push(state);
        insub = 0;
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);
      }
    }
    return PRF_TRAV_SIBLING; /* finished traversing face */
  }

  if (is_in_face && state->node->opcode == VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_vertex_list_get_count(state->node);
    ptr = prf_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i++) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                      ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }
  else if (is_in_face && state->node->opcode == MORPH_VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_morph_vertex_list_get_count(state->node) * 2;
    ptr = prf_morph_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i += 2) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                       ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray,my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }

  else if (is_in_face && prf_vertex_lookup(state->node, &vertex)) {
    array_append_float(vertexarray, vertex.x);
    array_append_float(vertexarray, vertex.y);
    array_append_float(vertexarray, vertex.z);

    array_append_float(texcoordarray, 0.0f);
    array_append_float(texcoordarray, 0.0f);
    if (color_per_vertex) {
      if (vertex.flags & 0x2000) {
        array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
      }
      else if (vertex.flags & 0x1000) {
        array_append_int(colorarray, vertex.packed_color);
      }
      else {
        array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
      }
    }
  }

  else if (is_in_face && state->node->opcode == POP_OPCODE) {
    float *mat;
    is_in_face = 0;

    mat = (float*) prf_state_get_matrix(state);

    if (array_count(vertexarray) == 1*3) {
      /* points not supported yet */
    }
    else if (array_count(vertexarray) == 2*3) {
#define idx ((faceset*)facesets[current_index])->lineIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx

      get_coords_3d(vertexarray, 0, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      get_coords_3d(vertexarray, 1, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      array_append_int(idx, -1);

      if (color_per_vertex) {
        packed_to_vec(colorarray[0], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        packed_to_vec(colorarray[1], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        array_append_int(colidx, -1);
      }
#undef idx
#undef bsp
#undef colbsp
#undef colidx
    }
    else if (array_count(vertexarray) >= 3*3) {

      int dotex = ((faceset*)facesets[current_index])->texture_pattern_index >= 0;

      if (color_per_vertex) {
        assert(array_count(colorarray) == array_count(vertexarray)/3);
      }
      if (dotex) {
        /*
        assert(array_count(texcoordarray) == array_count(vertexarray));
        */
      }
#define idx ((faceset*)facesets[current_index])->indices
#define tidx ((faceset*)facesets[current_index])->texIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx
#define texcoords ((faceset*)facesets[current_index])->texcoords

      n = array_count(vertexarray) / 3;
      for (i = 0; i < n; i++) {
        get_coords_3d(vertexarray, i ,tmp);
        mult_matrix_vec(mat, tmp);
        array_append_int(idx, bsp_add_point(bsp, tmp));
        if (dotex) {
          get_coords_2d(texcoordarray, i, tmp);
          array_append_int(tidx, bsp_add_point(texcoords, tmp));

        }
        if (color_per_vertex) {
          packed_to_vec(colorarray[i], tmp);
          array_append_int(colidx, bsp_add_point(colbsp, tmp));
        }
      }
      array_append_int(idx, -1);
      if (dotex) array_append_int(tidx, -1);
      if (color_per_vertex) array_append_int(colidx, -1);
    }
#undef idx
#undef tidx
#undef bsp
#undef colbsp
#undef colidx
#undef texcoords
  }
  return PRF_TRAV_CONTINUE;
}